

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void testing::internal::JsonUnitTestResultPrinter::PrintJsonUnitTest
               (ostream *stream,UnitTest *unit_test)

{
  bool bVar1;
  int iVar2;
  internal *piVar3;
  TestResult *result;
  ostream *poVar4;
  TestCase *pTVar5;
  int width;
  TimeInMillis ms;
  TimeInMillis ms_00;
  int local_228;
  allocator local_221;
  int i;
  bool comma;
  allocator local_1f9;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  allocator local_191;
  string local_190;
  string local_170;
  allocator local_149;
  string local_148;
  allocator local_121;
  string local_120;
  allocator local_f9;
  string local_f8;
  allocator local_d1;
  string local_d0;
  allocator local_a9;
  string local_a8;
  allocator local_81;
  string local_80;
  undefined1 local_60 [8];
  string kIndent;
  undefined1 local_38 [8];
  string kTestsuites;
  UnitTest *unit_test_local;
  ostream *stream_local;
  
  kTestsuites.field_2._8_8_ = unit_test;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_38,"testsuites",(allocator *)(kIndent.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(kIndent.field_2._M_local_buf + 0xf));
  Indent_abi_cxx11_((string *)local_60,(internal *)0x2,width);
  std::operator<<(stream,"{\n");
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_80,"tests",&local_81);
  iVar2 = UnitTest::reportable_test_count((UnitTest *)kTestsuites.field_2._8_8_);
  OutputJsonKey(stream,(string *)local_38,&local_80,iVar2,(string *)local_60,true);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a8,"failures",&local_a9);
  iVar2 = UnitTest::failed_test_count((UnitTest *)kTestsuites.field_2._8_8_);
  OutputJsonKey(stream,(string *)local_38,&local_a8,iVar2,(string *)local_60,true);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_d0,"disabled",&local_d1);
  iVar2 = UnitTest::reportable_disabled_test_count((UnitTest *)kTestsuites.field_2._8_8_);
  OutputJsonKey(stream,(string *)local_38,&local_d0,iVar2,(string *)local_60,true);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f8,"errors",&local_f9);
  OutputJsonKey(stream,(string *)local_38,&local_f8,0,(string *)local_60,true);
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_f9);
  if ((FLAGS_gtest_shuffle & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_120,"random_seed",&local_121);
    iVar2 = UnitTest::random_seed((UnitTest *)kTestsuites.field_2._8_8_);
    OutputJsonKey(stream,(string *)local_38,&local_120,iVar2,(string *)local_60,true);
    std::__cxx11::string::~string((string *)&local_120);
    std::allocator<char>::~allocator((allocator<char> *)&local_121);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_148,"timestamp",&local_149);
  piVar3 = (internal *)UnitTest::start_timestamp((UnitTest *)kTestsuites.field_2._8_8_);
  FormatEpochTimeInMillisAsRFC3339_abi_cxx11_(&local_170,piVar3,ms);
  OutputJsonKey(stream,(string *)local_38,&local_148,&local_170,(string *)local_60,true);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_148);
  std::allocator<char>::~allocator((allocator<char> *)&local_149);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_190,"time",&local_191);
  piVar3 = (internal *)UnitTest::elapsed_time((UnitTest *)kTestsuites.field_2._8_8_);
  FormatTimeInMillisAsDuration_abi_cxx11_(&local_1b8,piVar3,ms_00);
  OutputJsonKey(stream,(string *)local_38,&local_190,&local_1b8,(string *)local_60,false);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::~string((string *)&local_190);
  std::allocator<char>::~allocator((allocator<char> *)&local_191);
  result = UnitTest::ad_hoc_test_result((UnitTest *)kTestsuites.field_2._8_8_);
  TestPropertiesAsJson(&local_1d8,result,(string *)local_60);
  poVar4 = std::operator<<(stream,(string *)&local_1d8);
  std::operator<<(poVar4,",\n");
  std::__cxx11::string::~string((string *)&local_1d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1f8,"name",&local_1f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&i,"AllTests",&local_221);
  OutputJsonKey(stream,(string *)local_38,&local_1f8,(string *)&i,(string *)local_60,true);
  std::__cxx11::string::~string((string *)&i);
  std::allocator<char>::~allocator((allocator<char> *)&local_221);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
  poVar4 = std::operator<<(stream,(string *)local_60);
  poVar4 = std::operator<<(poVar4,"\"");
  poVar4 = std::operator<<(poVar4,(string *)local_38);
  std::operator<<(poVar4,"\": [\n");
  bVar1 = false;
  local_228 = 0;
  while( true ) {
    iVar2 = UnitTest::total_test_case_count((UnitTest *)kTestsuites.field_2._8_8_);
    if (iVar2 <= local_228) break;
    pTVar5 = UnitTest::GetTestCase((UnitTest *)kTestsuites.field_2._8_8_,local_228);
    iVar2 = TestCase::reportable_test_count(pTVar5);
    if (0 < iVar2) {
      if (bVar1) {
        std::operator<<(stream,",\n");
      }
      else {
        bVar1 = true;
      }
      pTVar5 = UnitTest::GetTestCase((UnitTest *)kTestsuites.field_2._8_8_,local_228);
      PrintJsonTestCase(stream,pTVar5);
    }
    local_228 = local_228 + 1;
  }
  poVar4 = std::operator<<(stream,"\n");
  poVar4 = std::operator<<(poVar4,(string *)local_60);
  poVar4 = std::operator<<(poVar4,"]\n");
  std::operator<<(poVar4,"}\n");
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void JsonUnitTestResultPrinter::PrintJsonUnitTest(std::ostream* stream,
                                                  const UnitTest& unit_test) {
  const std::string kTestsuites = "testsuites";
  const std::string kIndent = Indent(2);
  *stream << "{\n";

  OutputJsonKey(stream, kTestsuites, "tests", unit_test.reportable_test_count(),
                kIndent);
  OutputJsonKey(stream, kTestsuites, "failures", unit_test.failed_test_count(),
                kIndent);
  OutputJsonKey(stream, kTestsuites, "disabled",
                unit_test.reportable_disabled_test_count(), kIndent);
  OutputJsonKey(stream, kTestsuites, "errors", 0, kIndent);
  if (GTEST_FLAG(shuffle)) {
    OutputJsonKey(stream, kTestsuites, "random_seed", unit_test.random_seed(),
                  kIndent);
  }
  OutputJsonKey(stream, kTestsuites, "timestamp",
                FormatEpochTimeInMillisAsRFC3339(unit_test.start_timestamp()),
                kIndent);
  OutputJsonKey(stream, kTestsuites, "time",
                FormatTimeInMillisAsDuration(unit_test.elapsed_time()), kIndent,
                false);

  *stream << TestPropertiesAsJson(unit_test.ad_hoc_test_result(), kIndent)
          << ",\n";

  OutputJsonKey(stream, kTestsuites, "name", "AllTests", kIndent);
  *stream << kIndent << "\"" << kTestsuites << "\": [\n";

  bool comma = false;
  for (int i = 0; i < unit_test.total_test_case_count(); ++i) {
    if (unit_test.GetTestCase(i)->reportable_test_count() > 0) {
      if (comma) {
        *stream << ",\n";
      } else {
        comma = true;
      }
      PrintJsonTestCase(stream, *unit_test.GetTestCase(i));
    }
  }

  *stream << "\n" << kIndent << "]\n" << "}\n";
}